

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O0

date_time *
mjs::anon_unknown_37::date_helper::date_time_from_time(date_time *__return_storage_ptr__,double t)

{
  int64_t iVar1;
  undefined1 local_48 [8];
  tm tm;
  double t_local;
  
  tm.tm_zone = (char *)t;
  tm_from_time((tm *)local_48,t);
  __return_storage_ptr__->year = (double)(tm.tm_mday + 0x76c);
  __return_storage_ptr__->month = (double)tm.tm_hour;
  __return_storage_ptr__->day = (double)tm.tm_min;
  __return_storage_ptr__->h = (double)tm.tm_sec;
  __return_storage_ptr__->m = (double)(int)local_48._4_4_;
  __return_storage_ptr__->s = (double)(int)local_48._0_4_;
  iVar1 = ms_from_time((double)tm.tm_zone);
  __return_storage_ptr__->ms = (double)iVar1;
  return __return_storage_ptr__;
}

Assistant:

static date_time date_time_from_time(double t) {
        const auto tm = tm_from_time(t);
        return {
            static_cast<double>(tm.tm_year+1900), static_cast<double>(tm.tm_mon), static_cast<double>(tm.tm_mday),
            static_cast<double>(tm.tm_hour), static_cast<double>(tm.tm_min), static_cast<double>(tm.tm_sec), static_cast<double>(ms_from_time(t))
        };
    }